

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManSerializer.cpp
# Opt level: O3

int __thiscall
adios2::format::DataManSerializer::GetData<std::__cxx11::string>
          (DataManSerializer *this,string *outputData,string *varName,Dims *varStart,Dims *varCount,
          size_t step,MemorySpace varMemSpace,Dims *varMemStart,Dims *varMemCount)

{
  mutex *__mutex;
  long lVar1;
  size_t __n;
  int iVar2;
  iterator iVar3;
  undefined8 uVar4;
  long lVar5;
  DataManVar *j;
  long lVar6;
  ScopedTimer local_80;
  long *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_70 [2];
  string *local_60;
  size_t local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_60 = outputData;
  local_58 = step;
  if ((GetData<std::__cxx11::string>(std::__cxx11::string*,std::__cxx11::string_const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long,adios2::MemorySpace,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
       ::__var677 == '\0') &&
     (iVar2 = __cxa_guard_acquire(&GetData<std::__cxx11::string>(std::__cxx11::string*,std::__cxx11::string_const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long,adios2::MemorySpace,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                                   ::__var677), iVar2 != 0)) {
    uVar4 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/dataman/DataManSerializer.cpp"
                                ,
                                "int adios2::format::DataManSerializer::GetData(std::string *, const std::string &, const Dims &, const Dims &, const size_t, const MemorySpace, const Dims &, const Dims &)"
                                ,0x2a5);
    GetData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    __var677 = (void *)ps_timer_create_(uVar4);
    __cxa_guard_release(&GetData<std::__cxx11::string>(std::__cxx11::string*,std::__cxx11::string_const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long,adios2::MemorySpace,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                         ::__var677);
  }
  local_80.m_timer =
       GetData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
       __var677;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  local_78 = (long *)0x0;
  a_Stack_70[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __mutex = &this->m_DataManVarMapMutex;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    iVar3 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->m_DataManVarMap)._M_h,&local_58);
    if (iVar3.
        super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      iVar2 = -1;
    }
    else {
      local_78 = *(long **)((long)iVar3.
                                  super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>,_false>
                                  ._M_cur + 0x10);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (a_Stack_70,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)iVar3.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>,_false>
                        ._M_cur + 0x18));
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      if (local_78 == (long *)0x0) {
        iVar2 = -2;
      }
      else {
        lVar6 = *local_78;
        lVar1 = local_78[1];
        iVar2 = 0;
        if (lVar6 != lVar1) {
          do {
            __n = *(size_t *)(lVar6 + 0x58);
            if ((__n == varName->_M_string_length) &&
               (((__n == 0 ||
                 (iVar2 = bcmp(*(void **)(lVar6 + 0x50),(varName->_M_dataplus)._M_p,__n), iVar2 == 0
                 )) && (*(long **)(lVar6 + 0x170) != (long *)0x0)))) {
              lVar5 = **(long **)(lVar6 + 0x170) + *(long *)(lVar6 + 0xf0);
              local_50[0] = local_40;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_50,lVar5,*(long *)(lVar6 + 0xe8) + lVar5);
              std::__cxx11::string::operator=((string *)local_60,(string *)local_50);
              if (local_50[0] != local_40) {
                operator_delete(local_50[0]);
              }
            }
            lVar6 = lVar6 + 0x180;
            iVar2 = 0;
          } while (lVar6 != lVar1);
        }
      }
    }
    if (a_Stack_70[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_70[0]._M_pi);
    }
    external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_80);
    return iVar2;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

int DataManSerializer::GetData(std::string *outputData, const std::string &varName,
                               const Dims &varStart, const Dims &varCount, const size_t step,
                               const MemorySpace varMemSpace, const Dims &varMemStart,
                               const Dims &varMemCount)
{
    PERFSTUBS_SCOPED_TIMER_FUNC();

    DmvVecPtr vec = nullptr;

    {
        std::lock_guard<std::mutex> l(m_DataManVarMapMutex);
        const auto &i = m_DataManVarMap.find(step);
        if (i == m_DataManVarMap.end())
        {
            return -1; // step not found
        }
        else
        {
            vec = i->second;
        }
    }

    if (vec == nullptr)
    {
        return -2; // step found but variable not found
    }

    char *input_data = nullptr;

    for (const auto &j : *vec)
    {
        if (j.name == varName)
        {
            if (j.buffer == nullptr)
            {
                continue;
            }
            else
            {
                input_data = reinterpret_cast<char *>(j.buffer->data());
            }

            input_data += j.position;

            *outputData = std::string(input_data, j.size);
        }
    }
    return 0;
}